

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O1

int MPIABI_Alltoallw(void *sendbuf,int *sendcounts,int *sdispls,MPIABI_Datatype *sendtypes,
                    void *recvbuf,int *recvcounts,int *rdispls,MPIABI_Datatype *recvtypes,
                    MPIABI_Comm comm)

{
  int iVar1;
  
  iVar1 = MPI_Alltoallw();
  return iVar1;
}

Assistant:

int
MPIABI_Alltoallw(const void *sendbuf, const int sendcounts[],
                 const int sdispls[], const MPIABI_Datatype sendtypes[],
                 void *recvbuf, const int recvcounts[], const int rdispls[],
                 const MPIABI_Datatype recvtypes[], MPIABI_Comm comm) {
  if (sizeof(MPI_Datatype) == sizeof(MPIABI_Datatype))
    return MPI_Alltoallw(
        sendbuf, sendcounts, sdispls, (MPI_Datatype *)sendtypes, recvbuf,
        recvcounts, rdispls, (const MPI_Datatype *)recvtypes, (WPI_Comm)comm);
  int comm_size;
  MPI_Comm_size((WPI_Comm)comm, &comm_size);
  std::vector<MPI_Datatype> stypes(comm_size);
  for (int i = 0; i < comm_size; ++i)
    stypes[i] = (WPI_Datatype)sendtypes[i];
  std::vector<MPI_Datatype> rtypes(comm_size);
  for (int i = 0; i < comm_size; ++i)
    rtypes[i] = (WPI_Datatype)recvtypes[i];
  const int ierr =
      MPI_Alltoallw(sendbuf, sendcounts, sdispls, stypes.data(), recvbuf,
                    recvcounts, rdispls, rtypes.data(), (WPI_Comm)comm);
  return ierr;
}